

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_routines_hist.c
# Opt level: O2

int WebRtcIsac_DecHistBisectMulti
              (int *data,Bitstr *streamdata,uint16_t **cdf,uint16_t *cdf_size,int N)

{
  uint8_t *puVar1;
  uint uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  ushort *puVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  
  uVar7 = streamdata->W_upper;
  if (uVar7 == 0) {
    return -2;
  }
  puVar4 = streamdata->stream + streamdata->stream_index;
  if (streamdata->stream_index == 0) {
    uVar9 = *(uint *)puVar4;
    puVar4 = puVar4 + 3;
    uVar8 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  }
  else {
    uVar8 = streamdata->streamval;
  }
  uVar9 = 0;
  for (; 0 < N; N = N + -1) {
    uVar6 = uVar7 & 0xffff;
    uVar13 = uVar7 >> 0x10;
    uVar10 = (ulong)(*cdf_size >> 1);
    puVar5 = (ushort *)((long)*cdf + ((ulong)(*cdf_size & 0xfffffffe) - 2));
    while( true ) {
      uVar11 = (*puVar5 * uVar6 >> 0x10) + uVar13 * *puVar5;
      if ((uint)uVar10 < 2) break;
      uVar10 = (ulong)((uint)uVar10 >> 1);
      uVar12 = uVar10;
      uVar2 = uVar11;
      if (uVar8 <= uVar11) {
        uVar12 = -uVar10;
        uVar2 = uVar9;
        uVar7 = uVar11;
      }
      uVar9 = uVar2;
      puVar5 = puVar5 + uVar12;
    }
    cdf_size = cdf_size + 1;
    uVar6 = uVar11;
    if (uVar8 <= uVar11) {
      uVar7 = uVar11;
      uVar6 = uVar9;
    }
    *data = (int)((ulong)((long)puVar5 - (long)*cdf) >> 1) - (uint)(uVar8 <= uVar11);
    data = data + 1;
    uVar9 = uVar6 + 1;
    uVar8 = uVar8 - uVar9;
    for (uVar7 = uVar7 - uVar9; uVar7 < 0x1000000; uVar7 = uVar7 << 8) {
      puVar1 = puVar4 + 1;
      puVar4 = puVar4 + 1;
      uVar8 = uVar8 << 8 | (uint)*puVar1;
    }
    cdf = cdf + 1;
  }
  uVar3 = (int)puVar4 - (int)streamdata;
  streamdata->stream_index = uVar3;
  streamdata->W_upper = uVar7;
  streamdata->streamval = uVar8;
  if (0x1ffffff < uVar7) {
    return uVar3 - 2;
  }
  return uVar3 - 1;
}

Assistant:

int WebRtcIsac_DecHistBisectMulti(int *data,     /* output: data vector */
                                  Bitstr *streamdata,   /* in-/output struct containing bitstream */
                                  const uint16_t **cdf,  /* input: array of cdf arrays */
                                  const uint16_t *cdf_size, /* input: array of cdf table sizes+1 (power of two: 2^k) */
                                  const int N)    /* input: data vector length */
{
  uint32_t    W_lower, W_upper;
  uint32_t    W_tmp;
  uint32_t    W_upper_LSB, W_upper_MSB;
  uint32_t    streamval;
  const   uint8_t *stream_ptr;
  const   uint16_t *cdf_ptr;
  int     size_tmp;
  int     k;

  W_lower = 0; //to remove warning -DH
  stream_ptr = streamdata->stream + streamdata->stream_index;
  W_upper = streamdata->W_upper;
  if (W_upper == 0)
    /* Should not be possible in normal operation */
    return -2;

  if (streamdata->stream_index == 0)   /* first time decoder is called for this stream */
  {
    /* read first word from bytestream */
    streamval = *stream_ptr << 24;
    streamval |= *++stream_ptr << 16;
    streamval |= *++stream_ptr << 8;
    streamval |= *++stream_ptr;
  } else {
    streamval = streamdata->streamval;
  }

  for (k=N; k>0; k--)
  {
    /* find the integer *data for which streamval lies in [W_lower+1, W_upper] */
    W_upper_LSB = W_upper & 0x0000FFFF;
    W_upper_MSB = W_upper >> 16;

    /* start halfway the cdf range */
    size_tmp = *cdf_size++ >> 1;
    cdf_ptr = *cdf + (size_tmp - 1);

    /* method of bisection */
    for ( ;; )
    {
      W_tmp = W_upper_MSB * *cdf_ptr;
      W_tmp += (W_upper_LSB * *cdf_ptr) >> 16;
      size_tmp >>= 1;
      if (size_tmp == 0) break;
      if (streamval > W_tmp)
      {
        W_lower = W_tmp;
        cdf_ptr += size_tmp;
      } else {
        W_upper = W_tmp;
        cdf_ptr -= size_tmp;
      }
    }
    if (streamval > W_tmp)
    {
      W_lower = W_tmp;
      *data++ = (int)(cdf_ptr - *cdf++);
    } else {
      W_upper = W_tmp;
      *data++ = (int)(cdf_ptr - *cdf++ - 1);
    }

    /* shift interval to start at zero */
    W_upper -= ++W_lower;

    /* add integer to bitstream */
    streamval -= W_lower;

    /* renormalize interval and update streamval */
    while ( !(W_upper & 0xFF000000) )    /* W_upper < 2^24 */
    {
      /* read next byte from stream */
      streamval = (streamval << 8) | *++stream_ptr;
      W_upper <<= 8;
    }

    if (W_upper == 0)
      /* Should not be possible in normal operation */
      return -2;


  }

  streamdata->stream_index = (int)(stream_ptr - streamdata->stream);
  streamdata->W_upper = W_upper;
  streamdata->streamval = streamval;


  /* find number of bytes in original stream (determined by current interval width) */
  if ( W_upper > 0x01FFFFFF )
    return streamdata->stream_index - 2;
  else
    return streamdata->stream_index - 1;
}